

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O1

void amrex::BroadcastBool(bool *bBool,int myLocalId,int rootId,MPI_Comm *localComm)

{
  if (myLocalId != rootId) {
    *bBool = false;
  }
  return;
}

Assistant:

void amrex::BroadcastBool(bool &bBool, int myLocalId, int rootId, const MPI_Comm &localComm)
{
  int numBool = 0;
  if (myLocalId == rootId) {
    numBool = bBool;
  }

  amrex::ParallelDescriptor::Bcast(&numBool, 1, rootId, localComm);

  if(myLocalId != rootId) {
    bBool = numBool;
  }
}